

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

iterator * __thiscall
tcb::unicode::detail::
unicode_view<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_char32_t,_char>
::iterator::operator++(iterator *this)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  code_point value;
  encoded_chars<char> eVar4;
  char32_t c;
  iterator *this_local;
  
  bVar1 = this->idx_ + 1;
  this->idx_ = bVar1;
  uVar3 = encoded_chars<char>::size(&this->next_chars_);
  if ((bVar1 == uVar3) && (bVar2 = __gnu_cxx::operator!=(&this->first_,&this->last_), bVar2)) {
    value = utf_traits<char32_t,4>::
            decode<__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>>
                      (&this->first_,
                       (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                        )(this->last_)._M_current);
    eVar4 = utf_traits<char,_1>::encode(value);
    this->next_chars_ = eVar4;
    this->idx_ = '\0';
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }